

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_node.c
# Opt level: O2

REF_STATUS ref_node_deep_copy(REF_NODE *ref_node_ptr,REF_MPI ref_mpi,REF_NODE original)

{
  size_t __size;
  uint uVar1;
  int iVar2;
  uint uVar3;
  REF_DBL *pRVar4;
  REF_GLOB RVar5;
  REF_DBL RVar6;
  REF_INT RVar7;
  REF_NODE pRVar8;
  REF_GLOB *pRVar9;
  REF_INT *pRVar10;
  REF_DBL *pRVar11;
  uint uVar12;
  ulong uVar13;
  long lVar14;
  ulong uVar15;
  undefined8 uVar16;
  long lVar17;
  char *pcVar18;
  undefined8 uStack_40;
  
  pRVar8 = (REF_NODE)malloc(0xa0);
  *ref_node_ptr = pRVar8;
  if (pRVar8 == (REF_NODE)0x0) {
    pcVar18 = "malloc *ref_node_ptr of REF_NODE_STRUCT NULL";
    uStack_40 = 0x6c;
  }
  else {
    uVar1 = original->max;
    uVar15 = (ulong)uVar1;
    pRVar8->n = original->n;
    pRVar8->max = uVar1;
    if ((int)uVar1 < 0) {
      pcVar18 = "malloc ref_node->global of REF_GLOB negative";
      uVar16 = 0x74;
LAB_0015e0d3:
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uVar16
             ,"ref_node_deep_copy",pcVar18);
      return 1;
    }
    pRVar9 = (REF_GLOB *)malloc(uVar15 * 8);
    pRVar8->global = pRVar9;
    if (pRVar9 == (REF_GLOB *)0x0) {
      pcVar18 = "malloc ref_node->global of REF_GLOB NULL";
      uStack_40 = 0x74;
    }
    else {
      pRVar8->blank = original->blank;
      for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
        pRVar9[uVar13] = original->global[uVar13];
      }
      pRVar9 = (REF_GLOB *)malloc(uVar15 * 8);
      pRVar8->sorted_global = pRVar9;
      if (pRVar9 == (REF_GLOB *)0x0) {
        pcVar18 = "malloc ref_node->sorted_global of REF_GLOB NULL";
        uStack_40 = 0x79;
      }
      else {
        __size = uVar15 * 4;
        pRVar10 = (REF_INT *)malloc(__size);
        pRVar8->sorted_local = pRVar10;
        if (pRVar10 == (REF_INT *)0x0) {
          pcVar18 = "malloc ref_node->sorted_local of REF_INT NULL";
          uStack_40 = 0x7a;
        }
        else {
          for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
            pRVar9[uVar13] = original->sorted_global[uVar13];
          }
          for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
            pRVar10[uVar13] = original->sorted_local[uVar13];
          }
          pRVar10 = (REF_INT *)malloc(__size);
          pRVar8->part = pRVar10;
          if (pRVar10 == (REF_INT *)0x0) {
            pcVar18 = "malloc ref_node->part of REF_INT NULL";
            uStack_40 = 0x80;
          }
          else {
            for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
              pRVar10[uVar13] = original->part[uVar13];
            }
            pRVar10 = (REF_INT *)malloc(__size);
            pRVar8->age = pRVar10;
            if (pRVar10 == (REF_INT *)0x0) {
              pcVar18 = "malloc ref_node->age of REF_INT NULL";
              uStack_40 = 0x84;
            }
            else {
              for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                pRVar10[uVar13] = original->age[uVar13];
              }
              pRVar11 = (REF_DBL *)malloc(uVar15 * 0x78);
              pRVar8->real = pRVar11;
              if (pRVar11 == (REF_DBL *)0x0) {
                pcVar18 = "malloc ref_node->real of REF_DBL NULL";
                uStack_40 = 0x88;
              }
              else {
                lVar14 = 0;
                for (uVar13 = 0; uVar13 != uVar15; uVar13 = uVar13 + 1) {
                  pRVar4 = original->real;
                  for (lVar17 = 0; lVar17 != 0xf; lVar17 = lVar17 + 1) {
                    pRVar11[lVar17] = *(REF_DBL *)((long)pRVar4 + lVar17 * 8 + lVar14);
                  }
                  pRVar11 = pRVar11 + 0xf;
                  lVar14 = lVar14 + 0x78;
                }
                iVar2 = original->naux;
                pRVar8->naux = iVar2;
                pRVar8->aux = (REF_DBL *)0x0;
                if (0 < iVar2) {
                  fflush(_stdout);
                  uVar12 = pRVar8->max * pRVar8->naux;
                  pRVar11 = pRVar8->aux;
                  if (0 < (int)uVar12) {
                    pRVar11 = (REF_DBL *)realloc(pRVar11,(ulong)uVar12 << 3);
                    pRVar8->aux = pRVar11;
                  }
                  if (pRVar11 == (REF_DBL *)0x0) {
                    printf("%s: %d: %s: %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c"
                           ,0x91,"ref_node_deep_copy","realloc ref_node->aux NULL");
                    uVar15 = (long)pRVar8->max * (long)pRVar8->naux;
                    printf("failed to realloc n int %d uLong %lu size_of %lu = %lu\n",
                           uVar15 & 0xffffffff,uVar15,8,uVar15 * 8);
                    return 2;
                  }
                  for (uVar12 = 0; uVar12 != uVar1; uVar12 = uVar12 + 1) {
                    uVar3 = pRVar8->naux;
                    uVar15 = 0;
                    if (0 < (int)uVar3) {
                      uVar15 = (ulong)uVar3;
                    }
                    for (uVar13 = 0; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                      pRVar11[(long)(int)(uVar3 * uVar12) + uVar13] =
                           original->aux[(long)original->naux * (long)(int)uVar12 + uVar13];
                    }
                  }
                }
                pRVar8->ref_mpi = ref_mpi;
                uVar1 = original->n_unused;
                pRVar8->n_unused = uVar1;
                iVar2 = original->max_unused;
                pRVar8->max_unused = iVar2;
                if ((long)iVar2 < 0) {
                  pcVar18 = "malloc ref_node->unused_global of REF_GLOB negative";
                  uVar16 = 0x9b;
                  goto LAB_0015e0d3;
                }
                pRVar9 = (REF_GLOB *)malloc((long)iVar2 << 3);
                pRVar8->unused_global = pRVar9;
                if (pRVar9 != (REF_GLOB *)0x0) {
                  uVar13 = 0;
                  uVar15 = (ulong)uVar1;
                  if ((int)uVar1 < 1) {
                    uVar15 = uVar13;
                  }
                  for (; uVar15 != uVar13; uVar13 = uVar13 + 1) {
                    pRVar9[uVar13] = original->unused_global[uVar13];
                  }
                  RVar5 = original->new_n_global;
                  pRVar8->old_n_global = original->old_n_global;
                  pRVar8->new_n_global = RVar5;
                  RVar6 = original->min_uv_area;
                  pRVar8->min_volume = original->min_volume;
                  pRVar8->min_uv_area = RVar6;
                  pRVar8->same_normal_tol = original->same_normal_tol;
                  RVar7 = original->tri_quality;
                  pRVar8->tet_quality = original->tet_quality;
                  pRVar8->tri_quality = RVar7;
                  pRVar8->ratio_method = original->ratio_method;
                  return 0;
                }
                pcVar18 = "malloc ref_node->unused_global of REF_GLOB NULL";
                uStack_40 = 0x9b;
              }
            }
          }
        }
      }
    }
  }
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_node.c",uStack_40,
         "ref_node_deep_copy",pcVar18);
  return 2;
}

Assistant:

REF_FCN REF_STATUS ref_node_deep_copy(REF_NODE *ref_node_ptr, REF_MPI ref_mpi,
                                      REF_NODE original) {
  REF_INT max, node, i;
  REF_NODE ref_node;

  ref_malloc(*ref_node_ptr, 1, REF_NODE_STRUCT);
  ref_node = *ref_node_ptr;

  max = ref_node_max(original);

  ref_node_n(ref_node) = ref_node_n(original);
  ref_node_max(ref_node) = max;

  ref_malloc(ref_node->global, max, REF_GLOB);
  ref_node->blank = original->blank;
  for (node = 0; node < max; node++)
    ref_node->global[node] = original->global[node];

  ref_malloc(ref_node->sorted_global, max, REF_GLOB);
  ref_malloc(ref_node->sorted_local, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node->sorted_global[node] = original->sorted_global[node];
  for (node = 0; node < max; node++)
    ref_node->sorted_local[node] = original->sorted_local[node];

  ref_malloc(ref_node->part, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node_part(ref_node, node) = ref_node_part(original, node);

  ref_malloc(ref_node->age, max, REF_INT);
  for (node = 0; node < max; node++)
    ref_node_age(ref_node, node) = ref_node_age(original, node);

  ref_malloc(ref_node->real, REF_NODE_REAL_PER * max, REF_DBL);
  for (node = 0; node < max; node++)
    for (i = 0; i < REF_NODE_REAL_PER; i++)
      ref_node_real(ref_node, i, node) = ref_node_real(original, i, node);

  ref_node_naux(ref_node) = ref_node_naux(original);
  ref_node->aux = NULL;
  if (ref_node_naux(original) > 0) {
    ref_realloc(ref_node->aux, ref_node_naux(ref_node) * ref_node_max(ref_node),
                REF_DBL);
    for (node = 0; node < max; node++)
      for (i = 0; i < ref_node_naux(ref_node); i++)
        ref_node_aux(ref_node, i, node) = ref_node_aux(original, i, node);
  }

  ref_node_mpi(ref_node) = ref_mpi; /* reference only */

  ref_node->n_unused = original->n_unused;
  ref_node->max_unused = original->max_unused;
  ref_malloc(ref_node->unused_global, ref_node_max_unused(ref_node), REF_GLOB);
  for (i = 0; i < ref_node_n_unused(ref_node); i++)
    ref_node->unused_global[i] = original->unused_global[i];

  ref_node->old_n_global = original->old_n_global;
  ref_node->new_n_global = original->new_n_global;

  ref_node->min_volume = original->min_volume;
  ref_node->min_uv_area = original->min_uv_area;
  ref_node->same_normal_tol = original->same_normal_tol;

  ref_node->tet_quality = original->tet_quality;
  ref_node->tri_quality = original->tri_quality;
  ref_node->ratio_method = original->ratio_method;

  return REF_SUCCESS;
}